

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_context.cpp
# Opt level: O0

HLPContext * __thiscall
r_exec::HLPContext::operator*(HLPContext *__return_storage_ptr__,HLPContext *this)

{
  HLPOverlay *this_00;
  char cVar1;
  uint16_t uVar2;
  Atom *pAVar3;
  HLPContext local_90;
  HLPContext local_70;
  Atom *local_50;
  Atom *value_code;
  HLPContext local_38;
  HLPContext *local_18;
  HLPContext *this_local;
  
  local_18 = this;
  this_local = __return_storage_ptr__;
  operator[](this,0);
  cVar1 = r_code::Atom::getDescriptor();
  if (cVar1 == -0x7c) {
    pAVar3 = (this->super__Context).code;
    operator[](this,0);
    uVar2 = r_code::Atom::asIndex();
    HLPContext(&local_38,pAVar3,uVar2,(HLPOverlay *)(this->super__Context).overlay,
               (this->super__Context).data);
    operator*(__return_storage_ptr__,&local_38);
    ~HLPContext(&local_38);
  }
  else if (cVar1 == -0x7a) {
    this_00 = (HLPOverlay *)(this->super__Context).overlay;
    operator[](this,0);
    uVar2 = r_code::Atom::asIndex();
    local_50 = HLPOverlay::get_value_code(this_00,uVar2);
    if (local_50 == (Atom *)0x0) {
      HLPContext(__return_storage_ptr__);
    }
    else {
      HLPContext(&local_70,local_50,0,(HLPOverlay *)(this->super__Context).overlay,BINDING_MAP);
      operator*(__return_storage_ptr__,&local_70);
      ~HLPContext(&local_70);
    }
  }
  else if (cVar1 == -0x77) {
    pAVar3 = r_code::vector<r_code::Atom>::operator[](&((this->super__Context).overlay)->values,0);
    operator[](this,0);
    uVar2 = r_code::Atom::asIndex();
    HLPContext(&local_90,pAVar3,uVar2,(HLPOverlay *)(this->super__Context).overlay,VALUE_ARRAY);
    operator*(__return_storage_ptr__,&local_90);
    ~HLPContext(&local_90);
  }
  else {
    HLPContext(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

HLPContext HLPContext::operator *() const
{
    switch ((*this)[0].getDescriptor()) {
    case Atom::I_PTR:
        return *HLPContext(code, (*this)[0].asIndex(), (HLPOverlay *)overlay, data);

    case Atom::VL_PTR: {
        Atom *value_code = ((HLPOverlay *)overlay)->get_value_code((*this)[0].asIndex());

        if (value_code) {
            return *HLPContext(value_code, 0, (HLPOverlay *)overlay, BINDING_MAP);
        } else { // unbound variable.
            return HLPContext();    // data=undefined: evaluation will return false.
        }
    }

    case Atom::VALUE_PTR:
        return *HLPContext(&overlay->values[0], (*this)[0].asIndex(), (HLPOverlay *)overlay, VALUE_ARRAY);

    default:
        return *this;
    }
}